

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

schar fillholetyp(int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  uVar3 = 2;
  if (2 < x) {
    uVar3 = x;
  }
  uVar7 = 0x4e;
  if (x < 0x4e) {
    uVar7 = x;
  }
  iVar5 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar4 = 0;
  if ((int)(uVar3 - 1) <= (int)(uVar7 + 1)) {
    iVar2 = 0x13;
    if (y < 0x13) {
      iVar2 = y;
    }
    uVar9 = 1;
    if (1 < y) {
      uVar9 = (ulong)(uint)y;
    }
    puVar8 = (uint *)((long)level + (ulong)uVar3 * 0xfc + uVar9 * 0xc + -0xc2);
    iVar4 = 0;
    iVar13 = 0;
    iVar12 = 0;
    iVar5 = 0;
    lVar6 = (ulong)uVar3 - 1;
    do {
      puVar10 = puVar8;
      lVar11 = uVar9 - 2;
      if ((int)uVar9 + -1 <= iVar2 + 1) {
        do {
          switch(*(char *)((long)puVar10 + -2)) {
          case '\x11':
            iVar5 = iVar5 + 1;
            break;
          case '\x12':
switchD_00164719_caseD_12:
            iVar12 = iVar12 + 1;
            break;
          case '\x13':
            break;
          case '\x14':
            uVar3 = *puVar10 & 0x1c0;
            if (uVar3 == 0x100) {
LAB_00164748:
              iVar4 = iVar4 + 1;
            }
            else {
              if (uVar3 == 0x40) goto switchD_00164719_caseD_15;
              if (uVar3 == 0) goto switchD_00164719_caseD_12;
            }
            break;
          case '\x15':
switchD_00164719_caseD_15:
            iVar13 = iVar13 + 1;
            break;
          default:
            if (*(char *)((long)puVar10 + -2) == '#') goto LAB_00164748;
          }
          lVar11 = lVar11 + 1;
          puVar10 = puVar10 + 3;
        } while (lVar11 <= iVar2);
      }
      puVar8 = puVar8 + 0x3f;
      bVar1 = lVar6 <= (long)(ulong)uVar7;
      lVar6 = lVar6 + 1;
    } while (bVar1);
  }
  if ((iVar12 + iVar5 / 3 < iVar13) &&
     (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816((long)(iVar13 + 1)),0) != 0)) {
    return '\x15';
  }
  if ((0 < iVar12) && (uVar3 = mt_random(), uVar3 % (iVar12 + 1U) != 0)) {
    return '\x12';
  }
  if ((2 < iVar5) && (uVar3 = mt_random(), uVar3 % (iVar5 / 3 + 1U) != 0)) {
    return '\x11';
  }
  if ((0 < iVar4) && (uVar3 = mt_random(), uVar3 % (iVar4 + 1U) != 0)) {
    return '#';
  }
  return '\x19';
}

Assistant:

schar fillholetyp(int x, int y)
{
    int x1, y1;
    int lo_x = max(1,x-1), hi_x = min(x+1,COLNO-1),
	lo_y = max(0,y-1), hi_y = min(y+1,ROWNO-1);
    int pool_cnt = 0, moat_cnt = 0, lava_cnt = 0, swamp_cnt = 0;

    /* count the terrain types at and around x,y including those under drawbridges */
    for (x1 = lo_x; x1 <= hi_x; x1++)
	for (y1 = lo_y; y1 <= hi_y; y1++)
	    if (level->locations[x1][y1].typ == POOL)
		pool_cnt++;
	    else if (level->locations[x1][y1].typ == MOAT ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_MOAT))
		moat_cnt++;
	    else if (level->locations[x1][y1].typ == LAVAPOOL ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_LAVA))
		lava_cnt++;
	    else if (level->locations[x1][y1].typ == BOG ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_BOG))
		swamp_cnt++;
    pool_cnt /= 3;		/* not as much liquid as the others */

    if (lava_cnt > moat_cnt + pool_cnt && rn2(lava_cnt + 1))
	return LAVAPOOL;
    else if (moat_cnt > 0 && rn2(moat_cnt + 1))
	return MOAT;
    else if (pool_cnt > 0 && rn2(pool_cnt + 1))
	return POOL;
    else if (swamp_cnt > 0 && rn2(swamp_cnt + 1))
	return BOG;
    else
	return ROOM;
}